

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c++
# Opt level: O0

Url * __thiscall kj::Url::parseRelative(Url *__return_storage_ptr__,Url *this,StringPtr url)

{
  NullableValue<kj::Url> *pNVar1;
  Url *pUVar2;
  Fault local_310 [3];
  Url *local_2f8;
  char *pcStack_2f0;
  Maybe<kj::Url> local_2e0;
  undefined1 local_1f8 [8];
  NullableValue<kj::Url> _kj_result;
  Url *this_local;
  StringPtr url_local;
  
  pcStack_2f0 = (char *)url.content.size_;
  local_2f8 = (Url *)url.content.ptr;
  this_local = local_2f8;
  url_local.content.ptr = pcStack_2f0;
  url_local.content.size_ = (size_t)__return_storage_ptr__;
  tryParseRelative(&local_2e0,this,url);
  pNVar1 = _::readMaybe<kj::Url>(&local_2e0);
  _::NullableValue<kj::Url>::NullableValue((NullableValue<kj::Url> *)local_1f8,pNVar1);
  Maybe<kj::Url>::~Maybe(&local_2e0);
  pUVar2 = _::NullableValue::operator_cast_to_Url_((NullableValue *)local_1f8);
  if (pUVar2 != (Url *)0x0) {
    pNVar1 = mv<kj::_::NullableValue<kj::Url>>((NullableValue<kj::Url> *)local_1f8);
    _::NullableValue<kj::Url>::NullableValue
              ((NullableValue<kj::Url> *)&_kj_result.field_1.value.options,pNVar1);
    _::NullableValue<kj::Url>::~NullableValue((NullableValue<kj::Url> *)local_1f8);
    pUVar2 = _::NullableValue<kj::Url>::operator*
                       ((NullableValue<kj::Url> *)&_kj_result.field_1.value.options);
    Url(__return_storage_ptr__,pUVar2);
    _::NullableValue<kj::Url>::~NullableValue
              ((NullableValue<kj::Url> *)&_kj_result.field_1.value.options);
    return __return_storage_ptr__;
  }
  _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[21],kj::StringPtr&>
            (local_310,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url.c++"
             ,0x117,FAILED,"tryParseRelative(url) != nullptr","\"invalid relative URL\", url",
             (char (*) [21])"invalid relative URL",(StringPtr *)&this_local);
  _::Debug::Fault::fatal(local_310);
}

Assistant:

Url Url::parseRelative(StringPtr url) const {
  return KJ_REQUIRE_NONNULL(tryParseRelative(url), "invalid relative URL", url);
}